

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeRecordCompareWithSkip(int nKey1,void *pKey1,UnpackedRecord *pPKey2,int bSkip)

{
  double dVar1;
  uint uVar2;
  KeyInfo *pKVar3;
  u8 uVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  undefined8 uVar10;
  ushort uVar11;
  Mem *pMem2;
  ulong uVar12;
  byte *pbVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  bool bVar19;
  Mem mem1;
  uint local_a4;
  byte *local_a0;
  UnpackedRecord *local_98;
  u8 *local_90;
  uint local_84;
  double local_80;
  long local_78;
  long local_70;
  MemValue local_68;
  byte *local_60;
  uint local_58;
  undefined2 local_54;
  u8 local_52;
  sqlite3 *local_50;
  
  pMem2 = pPKey2->aMem;
  local_a0 = (byte *)pKey1;
  local_98 = pPKey2;
  if (bSkip == 0) {
    local_84 = (uint)*pKey1;
    if ((char)*pKey1 < '\0') {
      bVar5 = sqlite3GetVarint32((uchar *)pKey1,&local_84);
      uVar17 = (ulong)bVar5;
    }
    else {
      uVar17 = 1;
    }
    uVar12 = 0;
    uVar18 = local_84;
    uVar15 = local_84;
  }
  else {
    local_68.nZero = (int)*(byte *)((long)pKey1 + 1);
    uVar17 = 2;
    if ((char)*(byte *)((long)pKey1 + 1) < '\0') {
      uVar4 = sqlite3GetVarint32((uchar *)((long)pKey1 + 1),(u32 *)&local_68.nZero);
      uVar17 = (ulong)(byte)(uVar4 + 1);
    }
    if ((uint)local_68.nZero < 0x80) {
      uVar18 = (uint)""[(uint)local_68.nZero];
    }
    else {
      uVar18 = local_68.nZero - 0xcU >> 1;
    }
    pMem2 = pMem2 + 1;
    uVar12 = 1;
    uVar18 = uVar18 + *local_a0;
    uVar15 = (uint)*local_a0;
  }
  if ((uint)nKey1 < uVar18) {
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x151e1,
                "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
    local_98->errCode = '\v';
    return 0;
  }
  local_90 = &local_98->errCode;
  pbVar13 = local_a0;
  do {
    uVar11 = pMem2->flags;
    if ((uVar11 & 0x24) == 0) {
      if ((uVar11 & 8) != 0) {
        bVar5 = pbVar13[uVar17];
        uVar16 = (uint)bVar5;
        if (bVar5 < 10) {
          if (bVar5 == 0) {
            local_a4 = 0;
            goto LAB_001624ce;
          }
          sqlite3VdbeSerialGet(pbVar13 + uVar18,(uint)bVar5,(Mem *)&local_68);
          dVar1 = (pMem2->u).r;
          pbVar13 = local_a0;
          if (bVar5 == 7) {
            if (dVar1 <= (double)CONCAT44(local_68.i._4_4_,local_68.nZero)) {
              uVar16 = 7;
              if (dVar1 < (double)CONCAT44(local_68.i._4_4_,local_68.nZero)) goto LAB_001624b1;
              goto LAB_001623c1;
            }
          }
          else {
            local_78 = CONCAT44(local_68.i._4_4_,local_68.nZero);
            if (dVar1 <= (double)local_78) {
              local_80 = dVar1;
              uVar7 = (uint)(dVar1 < (double)local_78);
              goto LAB_00162122;
            }
          }
          local_a4 = 7;
LAB_001624ce:
          uVar6 = 0xffffffff;
          uVar16 = local_a4;
          goto LAB_001624d4;
        }
        goto LAB_001624a1;
      }
      if ((uVar11 & 2) == 0) {
        uVar16 = (uint)pbVar13[uVar17];
        if ((uVar11 & 0x10) != 0) {
          local_a4 = uVar16;
          if ((char)pbVar13[uVar17] < '\0') {
            sqlite3GetVarint32(pbVar13 + uVar17,&local_a4);
            pbVar13 = local_a0;
          }
          uVar6 = 0xffffffff;
          uVar16 = local_a4;
          if ((local_a4 < 0xc) || ((local_a4 & 1) != 0)) goto LAB_001624d4;
          uVar7 = local_a4 - 0xc >> 1;
          if (uVar7 + uVar18 <= (uint)nKey1) {
            if ((pMem2->flags & 0x400) == 0) goto LAB_00162307;
            if (local_a4 - 0xc != 0) {
              uVar14 = 0;
              do {
                if (pbVar13[uVar14 + uVar18] != 0) {
                  uVar6 = 1;
                  goto LAB_001624bf;
                }
                uVar14 = uVar14 + 1;
              } while (uVar7 != uVar14);
            }
            uVar7 = uVar7 - (pMem2->u).nZero;
            goto LAB_00162122;
          }
          uVar10 = 0x1524c;
          goto LAB_00162490;
        }
        uVar7 = (uint)(uVar16 != 10 && uVar16 != 0);
      }
      else {
        local_a4 = (uint)pbVar13[uVar17];
        if ((char)pbVar13[uVar17] < '\0') {
          sqlite3GetVarint32(pbVar13 + uVar17,&local_a4);
          pbVar13 = local_a0;
        }
        uVar16 = local_a4;
        if (local_a4 < 0xc) goto LAB_001624ce;
        if ((local_a4 & 1) == 0) {
          uVar6 = 1;
          uVar16 = 7;
          goto LAB_001624d4;
        }
        uVar7 = local_a4 - 0xc >> 1;
        local_58 = uVar7;
        if (((uint)nKey1 < uVar7 + uVar18) ||
           (pKVar3 = local_98->pKeyInfo, pKVar3->nAllField <= uVar12)) {
          uVar10 = 0x1522e;
          goto LAB_00162490;
        }
        if (pKVar3->aColl[uVar12] == (CollSeq *)0x0) {
LAB_00162307:
          uVar16 = local_a4;
          uVar2 = pMem2->n;
          uVar6 = uVar2;
          if ((int)uVar7 < (int)uVar2) {
            uVar6 = uVar7;
          }
          uVar6 = memcmp(pbVar13 + uVar18,pMem2->z,(long)(int)uVar6);
          pbVar13 = local_a0;
          uVar7 = uVar7 - uVar2;
          if (uVar6 != 0) {
            uVar16 = 7;
            goto LAB_001624d4;
          }
        }
        else {
          local_52 = pKVar3->enc;
          local_50 = pKVar3->db;
          local_54 = 2;
          local_60 = pbVar13 + uVar18;
          uVar7 = vdbeCompareMemString((Mem *)&local_68,pMem2,pKVar3->aColl[uVar12],local_90);
          pbVar13 = local_a0;
        }
      }
LAB_00162122:
      uVar6 = uVar7;
      if (uVar6 != 0) goto LAB_001624d4;
      goto LAB_001623c1;
    }
    bVar5 = pbVar13[uVar17];
    uVar16 = (uint)bVar5;
    if (9 < bVar5) {
LAB_001624a1:
      uVar6 = (uint)(bVar5 != 10) * 2 - 1;
LAB_001624bf:
      bVar19 = false;
      goto LAB_001624da;
    }
    if (bVar5 == 7) {
      uVar16 = 7;
      sqlite3VdbeSerialGet(pbVar13 + uVar18,7,(Mem *)&local_68);
      local_70 = (pMem2->u).i;
      if ((double)CONCAT44(local_68.i._4_4_,local_68.nZero) <= (double)local_70) {
        pbVar13 = local_a0;
        uVar7 = -(uint)((double)CONCAT44(local_68.i._4_4_,local_68.nZero) < (double)local_70);
        goto LAB_00162122;
      }
      goto LAB_001624b1;
    }
    uVar6 = 0xffffffff;
    if (bVar5 == 0) goto LAB_001624d4;
    if (5 < bVar5 - 1) {
      uVar14 = (ulong)(uVar16 - 8);
      goto LAB_001623b2;
    }
    switch((uint)bVar5) {
    case 1:
      uVar14 = (ulong)(char)pbVar13[uVar18];
      break;
    case 2:
      uVar9 = (long)(char)pbVar13[uVar18] << 8;
      uVar14 = (ulong)pbVar13[(ulong)uVar18 + 1];
      goto LAB_0016239f;
    case 3:
      uVar14 = (ulong)pbVar13[(ulong)uVar18 + 1] << 8 | (long)(char)pbVar13[uVar18] << 0x10;
      bVar5 = pbVar13[(ulong)uVar18 + 2];
      goto LAB_0016238c;
    case 4:
      uVar14 = (ulong)pbVar13[(ulong)uVar18 + 2] << 8 |
               (long)(int)((uint)pbVar13[uVar18] << 0x18) |
               (ulong)pbVar13[(ulong)uVar18 + 1] << 0x10;
      bVar5 = pbVar13[(ulong)uVar18 + 3];
LAB_0016238c:
      uVar14 = bVar5 | uVar14;
      break;
    case 5:
      uVar7 = *(uint *)(pbVar13 + (ulong)uVar18 + 2);
      uVar9 = (ulong)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                     uVar7 << 0x18);
      uVar14 = (ulong)(uint)(int)CONCAT11(pbVar13[uVar18],pbVar13[(ulong)uVar18 + 1]) << 0x20;
LAB_0016239f:
      uVar14 = uVar14 | uVar9;
      break;
    case 6:
      uVar14 = *(ulong *)(pbVar13 + uVar18);
      uVar14 = uVar14 >> 0x38 | (uVar14 & 0xff000000000000) >> 0x28 |
               (uVar14 & 0xff0000000000) >> 0x18 | (uVar14 & 0xff00000000) >> 8 |
               (uVar14 & 0xff000000) << 8 | (uVar14 & 0xff0000) << 0x18 | (uVar14 & 0xff00) << 0x28
               | uVar14 << 0x38;
    }
LAB_001623b2:
    if ((long)uVar14 < (pMem2->u).i) {
LAB_001624d4:
      bVar19 = uVar16 == 0;
LAB_001624da:
      bVar5 = local_98->pKeyInfo->aSortFlags[uVar12 & 0xffffffff];
      if (bVar5 == 0) {
        return uVar6;
      }
      if ((bVar5 & 2) != 0) {
        uVar11 = 1;
        if (!bVar19) {
          uVar11 = pMem2->flags & 1;
        }
        if ((bVar5 & 1) == uVar11) {
          return uVar6;
        }
      }
      return -uVar6;
    }
    if ((pMem2->u).i < (long)uVar14) {
LAB_001624b1:
      uVar6 = 1;
      goto LAB_001624d4;
    }
LAB_001623c1:
    uVar12 = uVar12 + 1;
    if (uVar12 == local_98->nField) {
LAB_0016245b:
      local_98->eqSeen = '\x01';
      return (int)local_98->default_rc;
    }
    if (uVar16 < 0x80) {
      uVar7 = (uint)""[uVar16];
    }
    else {
      uVar7 = uVar16 - 0xc >> 1;
    }
    uVar18 = uVar18 + uVar7;
    if ((uint)nKey1 < uVar18) goto LAB_0016245b;
    iVar8 = 1;
    if (0x7f < uVar16) {
      uVar14 = (ulong)uVar16;
      do {
        iVar8 = iVar8 + 1;
        bVar19 = 0x3fff < uVar14;
        uVar14 = uVar14 >> 7;
      } while (bVar19);
    }
    uVar16 = (int)uVar17 + iVar8;
    uVar17 = (ulong)uVar16;
    if (uVar15 <= uVar16) {
      uVar10 = 0x15278;
LAB_00162490:
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar10,
                  "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
      *local_90 = '\v';
      return 0;
    }
    pMem2 = pMem2 + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeRecordCompareWithSkip(
  int nKey1, const void *pKey1,   /* Left key */
  UnpackedRecord *pPKey2,         /* Right key */
  int bSkip                       /* If true, skip the first field */
){
  u32 d1;                         /* Offset into aKey[] of next data element */
  int i;                          /* Index of next field to compare */
  u32 szHdr1;                     /* Size of record header in bytes */
  u32 idx1;                       /* Offset of first type in header */
  int rc = 0;                     /* Return value */
  Mem *pRhs = pPKey2->aMem;       /* Next field of pPKey2 to compare */
  KeyInfo *pKeyInfo;
  const unsigned char *aKey1 = (const unsigned char *)pKey1;
  Mem mem1;

  /* If bSkip is true, then the caller has already determined that the first
  ** two elements in the keys are equal. Fix the various stack variables so
  ** that this routine begins comparing at the second field. */
  if( bSkip ){
    u32 s1 = aKey1[1];
    if( s1<0x80 ){
      idx1 = 2;
    }else{
      idx1 = 1 + sqlite3GetVarint32(&aKey1[1], &s1);
    }
    szHdr1 = aKey1[0];
    d1 = szHdr1 + sqlite3VdbeSerialTypeLen(s1);
    i = 1;
    pRhs++;
  }else{
    if( (szHdr1 = aKey1[0])<0x80 ){
      idx1 = 1;
    }else{
      idx1 = sqlite3GetVarint32(aKey1, &szHdr1);
    }
    d1 = szHdr1;
    i = 0;
  }
  if( d1>(unsigned)nKey1 ){
    pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
    return 0;  /* Corruption */
  }

  VVA_ONLY( mem1.szMalloc = 0; ) /* Only needed by assert() statements */
  assert( pPKey2->pKeyInfo->nAllField>=pPKey2->nField
       || CORRUPT_DB );
  assert( pPKey2->pKeyInfo->aSortFlags!=0 );
  assert( pPKey2->pKeyInfo->nKeyField>0 );
  assert( idx1<=szHdr1 || CORRUPT_DB );
  while( 1 /*exit-by-break*/ ){
    u32 serial_type;

    /* RHS is an integer */
    if( pRhs->flags & (MEM_Int|MEM_IntReal) ){
      testcase( pRhs->flags & MEM_Int );
      testcase( pRhs->flags & MEM_IntReal );
      serial_type = aKey1[idx1];
      testcase( serial_type==12 );
      if( serial_type>=10 ){
        rc = serial_type==10 ? -1 : +1;
      }else if( serial_type==0 ){
        rc = -1;
      }else if( serial_type==7 ){
        sqlite3VdbeSerialGet(&aKey1[d1], serial_type, &mem1);
        rc = -sqlite3IntFloatCompare(pRhs->u.i, mem1.u.r);
      }else{
        i64 lhs = vdbeRecordDecodeInt(serial_type, &aKey1[d1]);
        i64 rhs = pRhs->u.i;
        if( lhs<rhs ){
          rc = -1;
        }else if( lhs>rhs ){
          rc = +1;
        }
      }
    }

    /* RHS is real */
    else if( pRhs->flags & MEM_Real ){
      serial_type = aKey1[idx1];
      if( serial_type>=10 ){
        /* Serial types 12 or greater are strings and blobs (greater than
        ** numbers). Types 10 and 11 are currently "reserved for future
        ** use", so it doesn't really matter what the results of comparing
        ** them to numberic values are.  */
        rc = serial_type==10 ? -1 : +1;
      }else if( serial_type==0 ){
        rc = -1;
      }else{
        sqlite3VdbeSerialGet(&aKey1[d1], serial_type, &mem1);
        if( serial_type==7 ){
          if( mem1.u.r<pRhs->u.r ){
            rc = -1;
          }else if( mem1.u.r>pRhs->u.r ){
            rc = +1;
          }
        }else{
          rc = sqlite3IntFloatCompare(mem1.u.i, pRhs->u.r);
        }
      }
    }

    /* RHS is a string */
    else if( pRhs->flags & MEM_Str ){
      getVarint32NR(&aKey1[idx1], serial_type);
      testcase( serial_type==12 );
      if( serial_type<12 ){
        rc = -1;
      }else if( !(serial_type & 0x01) ){
        rc = +1;
      }else{
        mem1.n = (serial_type - 12) / 2;
        testcase( (d1+mem1.n)==(unsigned)nKey1 );
        testcase( (d1+mem1.n+1)==(unsigned)nKey1 );
        if( (d1+mem1.n) > (unsigned)nKey1
         || (pKeyInfo = pPKey2->pKeyInfo)->nAllField<=i
        ){
          pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
          return 0;                /* Corruption */
        }else if( pKeyInfo->aColl[i] ){
          mem1.enc = pKeyInfo->enc;
          mem1.db = pKeyInfo->db;
          mem1.flags = MEM_Str;
          mem1.z = (char*)&aKey1[d1];
          rc = vdbeCompareMemString(
              &mem1, pRhs, pKeyInfo->aColl[i], &pPKey2->errCode
          );
        }else{
          int nCmp = MIN(mem1.n, pRhs->n);
          rc = memcmp(&aKey1[d1], pRhs->z, nCmp);
          if( rc==0 ) rc = mem1.n - pRhs->n;
        }
      }
    }

    /* RHS is a blob */
    else if( pRhs->flags & MEM_Blob ){
      assert( (pRhs->flags & MEM_Zero)==0 || pRhs->n==0 );
      getVarint32NR(&aKey1[idx1], serial_type);
      testcase( serial_type==12 );
      if( serial_type<12 || (serial_type & 0x01) ){
        rc = -1;
      }else{
        int nStr = (serial_type - 12) / 2;
        testcase( (d1+nStr)==(unsigned)nKey1 );
        testcase( (d1+nStr+1)==(unsigned)nKey1 );
        if( (d1+nStr) > (unsigned)nKey1 ){
          pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
          return 0;                /* Corruption */
        }else if( pRhs->flags & MEM_Zero ){
          if( !isAllZero((const char*)&aKey1[d1],nStr) ){
            rc = 1;
          }else{
            rc = nStr - pRhs->u.nZero;
          }
        }else{
          int nCmp = MIN(nStr, pRhs->n);
          rc = memcmp(&aKey1[d1], pRhs->z, nCmp);
          if( rc==0 ) rc = nStr - pRhs->n;
        }
      }
    }

    /* RHS is null */
    else{
      serial_type = aKey1[idx1];
      rc = (serial_type!=0 && serial_type!=10);
    }

    if( rc!=0 ){
      int sortFlags = pPKey2->pKeyInfo->aSortFlags[i];
      if( sortFlags ){
        if( (sortFlags & KEYINFO_ORDER_BIGNULL)==0
         || ((sortFlags & KEYINFO_ORDER_DESC)
           !=(serial_type==0 || (pRhs->flags&MEM_Null)))
        ){
          rc = -rc;
        }
      }
      assert( vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, rc) );
      assert( mem1.szMalloc==0 );  /* See comment below */
      return rc;
    }

    i++;
    if( i==pPKey2->nField ) break;
    pRhs++;
    d1 += sqlite3VdbeSerialTypeLen(serial_type);
    if( d1>(unsigned)nKey1 ) break;
    idx1 += sqlite3VarintLen(serial_type);
    if( idx1>=(unsigned)szHdr1 ){
      pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
      return 0;  /* Corrupt index */
    }
  }

  /* No memory allocation is ever used on mem1.  Prove this using
  ** the following assert().  If the assert() fails, it indicates a
  ** memory leak and a need to call sqlite3VdbeMemRelease(&mem1).  */
  assert( mem1.szMalloc==0 );

  /* rc==0 here means that one or both of the keys ran out of fields and
  ** all the fields up to that point were equal. Return the default_rc
  ** value.  */
  assert( CORRUPT_DB
       || vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, pPKey2->default_rc)
       || pPKey2->pKeyInfo->db->mallocFailed
  );
  pPKey2->eqSeen = 1;
  return pPKey2->default_rc;
}